

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O2

void __thiscall ncnn::Mat::~Mat(Mat *this)

{
  release(this);
  return;
}

Assistant:

inline Mat::~Mat()
{
    release();
}